

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeComponentGraph.cxx
# Opt level: O3

void __thiscall cmComputeComponentGraph::TarjanVisit(cmComputeComponentGraph *this,size_t i)

{
  pointer *ppcVar1;
  pointer pTVar2;
  size_t *psVar3;
  pointer pcVar4;
  pointer pcVar5;
  iterator __position;
  iterator __position_00;
  long lVar6;
  long lVar7;
  _Elt_pointer puVar8;
  ulong uVar9;
  size_t sVar10;
  cmGraphEdge *ni;
  pointer pcVar11;
  long lVar12;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_00;
  size_t j;
  unsigned_long local_40;
  unsigned_long local_38;
  
  (this->TarjanVisited).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[i] = this->TarjanWalkId;
  pTVar2 = (this->TarjanEntries).
           super__Vector_base<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar2[i].Root = i;
  (this->TarjanComponents).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_start[i] = 0xffffffffffffffff;
  sVar10 = this->TarjanIndex + 1;
  this->TarjanIndex = sVar10;
  pTVar2[i].VisitIndex = sVar10;
  psVar3 = (this->TarjanStack).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_38 = i;
  if (psVar3 == (this->TarjanStack).c.
                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<unsigned_long,std::allocator<unsigned_long>>::_M_push_back_aux<unsigned_long_const&>
              ((deque<unsigned_long,std::allocator<unsigned_long>> *)&this->TarjanStack,&local_38);
  }
  else {
    *psVar3 = i;
    (this->TarjanStack).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Deque_impl_data._M_finish._M_cur = psVar3 + 1;
  }
  pcVar4 = (this->InputGraph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
           super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar11 = *(pointer *)&pcVar4[local_38].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
  pcVar5 = *(pointer *)((long)(pcVar4 + local_38) + 8);
  do {
    if (pcVar11 == pcVar5) {
      if ((this->TarjanEntries).
          super__Vector_base<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
          ._M_impl.super__Vector_impl_data._M_start[local_38].Root == local_38) {
        __position._M_current =
             (this->Components).
             super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
             super__Vector_impl_data._M_finish;
        lVar12 = (long)__position._M_current -
                 (long)(this->Components).
                       super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl
                       .super__Vector_impl_data._M_start;
        if (__position._M_current ==
            (this->Components).super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::_M_realloc_insert<>
                    (&this->Components,__position);
        }
        else {
          ((__position._M_current)->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((__position._M_current)->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ((__position._M_current)->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ppcVar1 = &(this->Components).
                     super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
        this_00 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                  (lVar12 + (long)(this->Components).
                                  super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
        do {
          puVar8 = (this->TarjanStack).c.
                   super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur;
          if (puVar8 == (this->TarjanStack).c.
                        super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_first) {
            puVar8 = (this->TarjanStack).c.
                     super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          local_40 = puVar8[-1];
          std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                    (&(this->TarjanStack).c);
          (this->TarjanComponents).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
          ._M_impl.super__Vector_impl_data._M_start[local_40] = (lVar12 >> 3) * -0x5555555555555555;
          (this->TarjanEntries).
          super__Vector_base<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
          ._M_impl.super__Vector_impl_data._M_start[local_40].Root = local_38;
          __position_00._M_current = *(unsigned_long **)(this_00 + 8);
          if (__position_00._M_current == *(unsigned_long **)(this_00 + 0x10)) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>(this_00,__position_00,&local_40);
          }
          else {
            *__position_00._M_current = local_40;
            *(unsigned_long **)(this_00 + 8) = __position_00._M_current + 1;
          }
        } while (local_40 != local_38);
        lVar12 = *(long *)this_00;
        lVar6 = *(long *)(this_00 + 8);
        if (lVar12 != lVar6) {
          uVar9 = lVar6 - lVar12 >> 3;
          lVar7 = 0x3f;
          if (uVar9 != 0) {
            for (; uVar9 >> lVar7 == 0; lVar7 = lVar7 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (lVar12,lVar6,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (lVar12,lVar6);
        }
      }
      return;
    }
    sVar10 = pcVar11->Dest;
    uVar9 = (this->TarjanVisited).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[sVar10];
    if (uVar9 == 0) {
      TarjanVisit(this,sVar10);
LAB_005b7b44:
      if ((this->TarjanComponents).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
          ._M_impl.super__Vector_impl_data._M_start[sVar10] == 0xffffffffffffffff) {
        pTVar2 = (this->TarjanEntries).
                 super__Vector_base<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pTVar2[pTVar2[sVar10].Root].VisitIndex < pTVar2[pTVar2[local_38].Root].VisitIndex) {
          pTVar2[local_38].Root = pTVar2[sVar10].Root;
        }
      }
    }
    else if (this->TarjanWalkId <= uVar9) goto LAB_005b7b44;
    pcVar11 = pcVar11 + 1;
  } while( true );
}

Assistant:

void cmComputeComponentGraph::TarjanVisit(size_t i)
{
  // We are now visiting this node.
  this->TarjanVisited[i] = this->TarjanWalkId;

  // Initialize the entry.
  this->TarjanEntries[i].Root = i;
  this->TarjanComponents[i] = INVALID_COMPONENT;
  this->TarjanEntries[i].VisitIndex = ++this->TarjanIndex;
  this->TarjanStack.push(i);

  // Follow outgoing edges.
  EdgeList const& nl = this->InputGraph[i];
  for (cmGraphEdge const& ni : nl) {
    size_t j = ni;

    // Ignore edges to nodes that have been reached by a previous DFS
    // walk.  Since we did not reach the current node from that walk
    // it must not belong to the same component and it has already
    // been assigned to a component.
    if (this->TarjanVisited[j] > 0 &&
        this->TarjanVisited[j] < this->TarjanWalkId) {
      continue;
    }

    // Visit the destination if it has not yet been visited.
    if (!this->TarjanVisited[j]) {
      this->TarjanVisit(j);
    }

    // If the destination has not yet been assigned to a component,
    // check if it has a better root for the current object.
    if (this->TarjanComponents[j] == INVALID_COMPONENT) {
      if (this->TarjanEntries[this->TarjanEntries[j].Root].VisitIndex <
          this->TarjanEntries[this->TarjanEntries[i].Root].VisitIndex) {
        this->TarjanEntries[i].Root = this->TarjanEntries[j].Root;
      }
    }
  }

  // Check if we have found a component.
  if (this->TarjanEntries[i].Root == i) {
    // Yes.  Create it.
    size_t c = this->Components.size();
    this->Components.emplace_back();
    NodeList& component = this->Components[c];

    // Populate the component list.
    size_t j;
    do {
      // Get the next member of the component.
      j = this->TarjanStack.top();
      this->TarjanStack.pop();

      // Assign the member to the component.
      this->TarjanComponents[j] = c;
      this->TarjanEntries[j].Root = i;

      // Store the node in its component.
      component.push_back(j);
    } while (j != i);

    // Sort the component members for clarity.
    std::sort(component.begin(), component.end());
  }
}